

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_map.h
# Opt level: O0

void __thiscall
lemon::
ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_std::vector<double,_std::allocator<double>_>_>
::~ArrayMap(ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_std::vector<double,_std::allocator<double>_>_>
            *this)

{
  bool bVar1;
  ObserverBase *in_RDI;
  
  in_RDI->_vptr_ObserverBase = (_func_int **)&PTR__ArrayMap_00313cc0;
  bVar1 = AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>
          ::ObserverBase::attached(in_RDI);
  if (bVar1) {
    (*in_RDI->_vptr_ObserverBase[7])();
    AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>
    ::ObserverBase::detach((ObserverBase *)0x2b7df6);
  }
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)&in_RDI[1]._index);
  AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>
  ::ObserverBase::~ObserverBase(in_RDI);
  return;
}

Assistant:

virtual ~ArrayMap() {
    if (attached()) {
      clear();
      detach();
    }
  }